

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall Imf_3_3::Context::addHeader(Context *this,int partnum,Header *h)

{
  bool bVar1;
  int iVar2;
  exr_result_t eVar3;
  Attribute *pAVar4;
  undefined4 extraout_var;
  char *pcVar5;
  Channel *pCVar6;
  undefined8 uVar7;
  element_type *pp_Var8;
  uint32_t in_ESI;
  exr_attr_chromaticities_t cac;
  Chromaticities ac;
  ChromaticitiesAttribute *attr_20;
  Box2fAttribute *attr_19;
  Box2iAttribute *attr_18;
  M44dAttribute *attr_17;
  M44fAttribute *attr_16;
  M33dAttribute *attr_15;
  M33fAttribute *attr_14;
  V3dAttribute *attr_13;
  V3fAttribute *attr_12;
  V3iAttribute *attr_11;
  V2dAttribute *attr_10;
  V2fAttribute *attr_9;
  V2iAttribute *attr_8;
  EnvmapAttribute *attr_7;
  CompressionAttribute *attr_6;
  DoubleAttribute *attr_5;
  FloatAttribute *attr_4;
  IntAttribute *attr_3;
  StringAttribute *attr_2;
  TileDescription td;
  TileDescriptionAttribute *attr_1;
  LineOrderAttribute *attr;
  Channel *cdef;
  ConstIterator c;
  ChannelList *chans;
  char *attrT;
  Attribute *a;
  ConstIterator i;
  exr_result_t rv;
  int in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  Chromaticities *in_stack_fffffffffffffa00;
  element_type in_stack_fffffffffffffa10;
  exr_tile_level_mode_t in_stack_fffffffffffffa18;
  uint32_t in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  exr_context_t in_stack_fffffffffffffa28;
  Attribute *in_stack_fffffffffffffa30;
  exr_context_t in_stack_fffffffffffffa38;
  char *in_stack_fffffffffffffa50;
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_> *local_5a0;
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_> *local_568;
  TypedAttribute<Imath_3_1::Matrix44<double>_> *local_530;
  TypedAttribute<Imath_3_1::Matrix44<float>_> *local_4f8;
  TypedAttribute<Imath_3_1::Matrix33<double>_> *local_4c0;
  TypedAttribute<Imath_3_1::Matrix33<float>_> *local_488;
  TypedAttribute<Imath_3_1::Vec3<double>_> *local_450;
  TypedAttribute<Imath_3_1::Vec3<float>_> *local_418;
  TypedAttribute<Imath_3_1::Vec3<int>_> *local_3e0;
  TypedAttribute<Imath_3_1::Vec2<double>_> *local_3a8;
  TypedAttribute<Imath_3_1::Vec2<float>_> *local_370;
  TypedAttribute<Imath_3_1::Vec2<int>_> *local_338;
  TypedAttribute<Imf_3_3::Envmap> *local_300;
  TypedAttribute<Imf_3_3::Compression> *local_2c8;
  TypedAttribute<double> *local_290;
  TypedAttribute<float> *local_258;
  TypedAttribute<int> *local_220;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1e8;
  TypedAttribute<Imf_3_3::TileDescription> *local_1c8;
  TypedAttribute<Imf_3_3::LineOrder> *local_198;
  char *__s1;
  
  Header::begin((Header *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  do {
    Header::end((Header *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    bVar1 = Imf_3_3::operator!=((ConstIterator *)in_stack_fffffffffffffa00,
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    if (!bVar1) {
      return;
    }
    pAVar4 = Header::ConstIterator::attribute((ConstIterator *)0x944033);
    iVar2 = (*pAVar4->_vptr_Attribute[2])();
    __s1 = (char *)CONCAT44(extraout_var,iVar2);
    pcVar5 = Header::ConstIterator::name((ConstIterator *)0x94405e);
    iVar2 = strcmp(pcVar5,"channels");
    if (iVar2 == 0) {
      Header::channels((Header *)0x944083);
      ChannelList::begin((ChannelList *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      while( true ) {
        ChannelList::end((ChannelList *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        bVar1 = Imf_3_3::operator!=((ConstIterator *)in_stack_fffffffffffffa00,
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        if (!bVar1) break;
        pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x9440e0);
        std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffa00);
        ChannelList::ConstIterator::name((ConstIterator *)0x94411b);
        in_stack_fffffffffffff9f8 = pCVar6->ySampling;
        eVar3 = exr_add_channel(in_stack_fffffffffffffa38,
                                (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                                (char *)in_stack_fffffffffffffa28,
                                (exr_pixel_type_t)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                (exr_perceptual_treatment_t)in_stack_fffffffffffffa20,
                                in_stack_fffffffffffffa1c,(int32_t)in_stack_fffffffffffffa50);
        if (eVar3 != 0) {
          uVar7 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc
                    ((ArgExc *)in_stack_fffffffffffffa00,
                     (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffa00);
      }
    }
    else {
      pcVar5 = Header::ConstIterator::name((ConstIterator *)0x944210);
      iVar2 = strcmp(pcVar5,"lineOrder");
      if (iVar2 == 0) {
        if (pAVar4 == (Attribute *)0x0) {
          local_198 = (TypedAttribute<Imf_3_3::LineOrder> *)0x0;
        }
        else {
          local_198 = (TypedAttribute<Imf_3_3::LineOrder> *)
                      __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                     &TypedAttribute<Imf_3_3::LineOrder>::typeinfo,0);
        }
        if (local_198 == (TypedAttribute<Imf_3_3::LineOrder> *)0x0) {
          uVar7 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc
                    ((ArgExc *)in_stack_fffffffffffffa00,
                     (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
        std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffa00);
        TypedAttribute<Imf_3_3::LineOrder>::value(local_198);
        eVar3 = exr_set_lineorder((exr_context_t)
                                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                                  (int)((ulong)in_stack_fffffffffffffa10 >> 0x20),
                                  (exr_lineorder_t)in_stack_fffffffffffffa10);
        if (eVar3 != 0) {
          uVar7 = __cxa_allocate_exception(0x48);
          Iex_3_3::ArgExc::ArgExc
                    ((ArgExc *)in_stack_fffffffffffffa00,
                     (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
        }
      }
      else {
        iVar2 = strcmp(__s1,"tiledesc");
        if (iVar2 == 0) {
          if (pAVar4 == (Attribute *)0x0) {
            local_1c8 = (TypedAttribute<Imf_3_3::TileDescription> *)0x0;
          }
          else {
            local_1c8 = (TypedAttribute<Imf_3_3::TileDescription> *)
                        __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                       &TypedAttribute<Imf_3_3::TileDescription>::typeinfo,0);
          }
          if (local_1c8 == (TypedAttribute<Imf_3_3::TileDescription> *)0x0) {
            uVar7 = __cxa_allocate_exception(0x48);
            Iex_3_3::ArgExc::ArgExc
                      ((ArgExc *)in_stack_fffffffffffffa00,
                       (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
          }
          TypedAttribute<Imf_3_3::TileDescription>::value(local_1c8);
          std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffffa00);
          eVar3 = exr_set_tile_descriptor
                            (in_stack_fffffffffffffa28,
                             (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                             in_stack_fffffffffffffa18,
                             (exr_tile_round_mode_t)((ulong)in_stack_fffffffffffffa10 >> 0x20));
          if (eVar3 != 0) {
            uVar7 = __cxa_allocate_exception(0x48);
            Iex_3_3::ArgExc::ArgExc
                      ((ArgExc *)in_stack_fffffffffffffa00,
                       (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
          }
        }
        else {
          iVar2 = strcmp(__s1,"string");
          if (iVar2 == 0) {
            if (pAVar4 == (Attribute *)0x0) {
              local_1e8 = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0;
            }
            else {
              local_1e8 = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)__dynamic_cast(pAVar4,&Attribute::typeinfo,
                                            &TypedAttribute<std::__cxx11::string>::typeinfo,0);
            }
            if (local_1e8 ==
                (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              uVar7 = __cxa_allocate_exception(0x48);
              Iex_3_3::ArgExc::ArgExc
                        ((ArgExc *)in_stack_fffffffffffffa00,
                         (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
            }
            std::
            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffffa00);
            Header::ConstIterator::name((ConstIterator *)0x94469d);
            TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(local_1e8);
            std::__cxx11::string::c_str();
            eVar3 = exr_attr_set_string(in_stack_fffffffffffffa38,
                                        (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                                        (char *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20)
            ;
            if (eVar3 != 0) {
              uVar7 = __cxa_allocate_exception(0x48);
              Iex_3_3::ArgExc::ArgExc
                        ((ArgExc *)in_stack_fffffffffffffa00,
                         (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
            }
          }
          else {
            iVar2 = strcmp(__s1,"int");
            if (iVar2 == 0) {
              if (pAVar4 == (Attribute *)0x0) {
                local_220 = (TypedAttribute<int> *)0x0;
              }
              else {
                local_220 = (TypedAttribute<int> *)
                            __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                           &TypedAttribute<int>::typeinfo,0);
              }
              if (local_220 == (TypedAttribute<int> *)0x0) {
                uVar7 = __cxa_allocate_exception(0x48);
                Iex_3_3::ArgExc::ArgExc
                          ((ArgExc *)in_stack_fffffffffffffa00,
                           (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
              }
              std::
              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffa00);
              Header::ConstIterator::name((ConstIterator *)0x944873);
              TypedAttribute<int>::value(local_220);
              eVar3 = exr_attr_set_int(in_stack_fffffffffffffa28,
                                       (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                       (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                        in_stack_fffffffffffffa18),
                                       (int32_t)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              if (eVar3 != 0) {
                uVar7 = __cxa_allocate_exception(0x48);
                Iex_3_3::ArgExc::ArgExc
                          ((ArgExc *)in_stack_fffffffffffffa00,
                           (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
              }
            }
            else {
              iVar2 = strcmp(__s1,"float");
              if (iVar2 == 0) {
                if (pAVar4 == (Attribute *)0x0) {
                  local_258 = (TypedAttribute<float> *)0x0;
                }
                else {
                  local_258 = (TypedAttribute<float> *)
                              __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                             &TypedAttribute<float>::typeinfo,0);
                }
                if (local_258 == (TypedAttribute<float> *)0x0) {
                  uVar7 = __cxa_allocate_exception(0x48);
                  Iex_3_3::ArgExc::ArgExc
                            ((ArgExc *)in_stack_fffffffffffffa00,
                             (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                }
                std::
                __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)in_stack_fffffffffffffa00);
                Header::ConstIterator::name((ConstIterator *)0x944a40);
                TypedAttribute<float>::value(local_258);
                eVar3 = exr_attr_set_float(in_stack_fffffffffffffa28,
                                           (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                           (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                            in_stack_fffffffffffffa18),
                                           (float)((ulong)in_stack_fffffffffffffa10 >> 0x20));
                if (eVar3 != 0) {
                  uVar7 = __cxa_allocate_exception(0x48);
                  Iex_3_3::ArgExc::ArgExc
                            ((ArgExc *)in_stack_fffffffffffffa00,
                             (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                }
              }
              else {
                iVar2 = strcmp(__s1,"double");
                if (iVar2 == 0) {
                  if (pAVar4 == (Attribute *)0x0) {
                    local_290 = (TypedAttribute<double> *)0x0;
                  }
                  else {
                    local_290 = (TypedAttribute<double> *)
                                __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                               &TypedAttribute<double>::typeinfo,0);
                  }
                  if (local_290 == (TypedAttribute<double> *)0x0) {
                    uVar7 = __cxa_allocate_exception(0x48);
                    Iex_3_3::ArgExc::ArgExc
                              ((ArgExc *)in_stack_fffffffffffffa00,
                               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)
                              );
                    __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                  }
                  std::
                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffffa00);
                  Header::ConstIterator::name((ConstIterator *)0x944c0f);
                  TypedAttribute<double>::value(local_290);
                  eVar3 = exr_attr_set_double(in_stack_fffffffffffffa28,
                                              (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                              (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                               in_stack_fffffffffffffa18),
                                              (double)in_stack_fffffffffffffa10);
                  if (eVar3 != 0) {
                    uVar7 = __cxa_allocate_exception(0x48);
                    Iex_3_3::ArgExc::ArgExc
                              ((ArgExc *)in_stack_fffffffffffffa00,
                               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)
                              );
                    __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                  }
                }
                else {
                  iVar2 = strcmp(__s1,"compression");
                  if (iVar2 == 0) {
                    if (pAVar4 == (Attribute *)0x0) {
                      local_2c8 = (TypedAttribute<Imf_3_3::Compression> *)0x0;
                    }
                    else {
                      local_2c8 = (TypedAttribute<Imf_3_3::Compression> *)
                                  __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                 &TypedAttribute<Imf_3_3::Compression>::typeinfo,0);
                    }
                    if (local_2c8 == (TypedAttribute<Imf_3_3::Compression> *)0x0) {
                      uVar7 = __cxa_allocate_exception(0x48);
                      Iex_3_3::ArgExc::ArgExc
                                ((ArgExc *)in_stack_fffffffffffffa00,
                                 (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                      __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                    }
                    std::
                    __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)in_stack_fffffffffffffa00);
                    Header::ConstIterator::name((ConstIterator *)0x944dde);
                    TypedAttribute<Imf_3_3::Compression>::value(local_2c8);
                    eVar3 = exr_attr_set_compression
                                      (in_stack_fffffffffffffa28,
                                       (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                       (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                        in_stack_fffffffffffffa18),
                                       (exr_compression_t)((ulong)in_stack_fffffffffffffa10 >> 0x20)
                                      );
                    if (eVar3 != 0) {
                      uVar7 = __cxa_allocate_exception(0x48);
                      Iex_3_3::ArgExc::ArgExc
                                ((ArgExc *)in_stack_fffffffffffffa00,
                                 (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                      __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                    }
                  }
                  else {
                    iVar2 = strcmp(__s1,"envmap");
                    if (iVar2 == 0) {
                      if (pAVar4 == (Attribute *)0x0) {
                        local_300 = (TypedAttribute<Imf_3_3::Envmap> *)0x0;
                      }
                      else {
                        local_300 = (TypedAttribute<Imf_3_3::Envmap> *)
                                    __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                   &TypedAttribute<Imf_3_3::Envmap>::typeinfo,0);
                      }
                      if (local_300 == (TypedAttribute<Imf_3_3::Envmap> *)0x0) {
                        uVar7 = __cxa_allocate_exception(0x48);
                        Iex_3_3::ArgExc::ArgExc
                                  ((ArgExc *)in_stack_fffffffffffffa00,
                                   (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                    in_stack_fffffffffffff9f8));
                        __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                      }
                      std::
                      __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)in_stack_fffffffffffffa00);
                      Header::ConstIterator::name((ConstIterator *)0x944fab);
                      TypedAttribute<Imf_3_3::Envmap>::value(local_300);
                      eVar3 = exr_attr_set_envmap(in_stack_fffffffffffffa28,
                                                  (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_envmap_t)
                                                  ((ulong)in_stack_fffffffffffffa10 >> 0x20));
                      if (eVar3 != 0) {
                        uVar7 = __cxa_allocate_exception(0x48);
                        Iex_3_3::ArgExc::ArgExc
                                  ((ArgExc *)in_stack_fffffffffffffa00,
                                   (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                    in_stack_fffffffffffff9f8));
                        __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                      }
                    }
                    else {
                      iVar2 = strcmp(__s1,"v2i");
                      if (iVar2 == 0) {
                        if (pAVar4 == (Attribute *)0x0) {
                          local_338 = (TypedAttribute<Imath_3_1::Vec2<int>_> *)0x0;
                        }
                        else {
                          local_338 = (TypedAttribute<Imath_3_1::Vec2<int>_> *)
                                      __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                     &TypedAttribute<Imath_3_1::Vec2<int>>::typeinfo
                                                     ,0);
                        }
                        if (local_338 == (TypedAttribute<Imath_3_1::Vec2<int>_> *)0x0) {
                          uVar7 = __cxa_allocate_exception(0x48);
                          Iex_3_3::ArgExc::ArgExc
                                    ((ArgExc *)in_stack_fffffffffffffa00,
                                     (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                      in_stack_fffffffffffff9f8));
                          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                        }
                        std::
                        __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)in_stack_fffffffffffffa00);
                        Header::ConstIterator::name((ConstIterator *)0x945178);
                        TypedAttribute<Imath_3_1::Vec2<int>_>::value(local_338);
                        eVar3 = exr_attr_set_v2i(in_stack_fffffffffffffa28,
                                                 (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                                 (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                  in_stack_fffffffffffffa18),
                                                 (exr_attr_v2i_t *)in_stack_fffffffffffffa10);
                        if (eVar3 != 0) {
                          uVar7 = __cxa_allocate_exception(0x48);
                          Iex_3_3::ArgExc::ArgExc
                                    ((ArgExc *)in_stack_fffffffffffffa00,
                                     (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                      in_stack_fffffffffffff9f8));
                          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                        }
                      }
                      else {
                        iVar2 = strcmp(__s1,"v2f");
                        if (iVar2 == 0) {
                          if (pAVar4 == (Attribute *)0x0) {
                            local_370 = (TypedAttribute<Imath_3_1::Vec2<float>_> *)0x0;
                          }
                          else {
                            local_370 = (TypedAttribute<Imath_3_1::Vec2<float>_> *)
                                        __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                       &TypedAttribute<Imath_3_1::Vec2<float>>::
                                                        typeinfo,0);
                          }
                          if (local_370 == (TypedAttribute<Imath_3_1::Vec2<float>_> *)0x0) {
                            uVar7 = __cxa_allocate_exception(0x48);
                            Iex_3_3::ArgExc::ArgExc
                                      ((ArgExc *)in_stack_fffffffffffffa00,
                                       (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                        in_stack_fffffffffffff9f8));
                            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                          }
                          std::
                          __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)in_stack_fffffffffffffa00);
                          Header::ConstIterator::name((ConstIterator *)0x945346);
                          TypedAttribute<Imath_3_1::Vec2<float>_>::value(local_370);
                          eVar3 = exr_attr_set_v2f(in_stack_fffffffffffffa28,
                                                   (int)((ulong)in_stack_fffffffffffffa20 >> 0x20),
                                                   (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                    in_stack_fffffffffffffa18),
                                                   (exr_attr_v2f_t *)in_stack_fffffffffffffa10);
                          if (eVar3 != 0) {
                            uVar7 = __cxa_allocate_exception(0x48);
                            Iex_3_3::ArgExc::ArgExc
                                      ((ArgExc *)in_stack_fffffffffffffa00,
                                       (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                        in_stack_fffffffffffff9f8));
                            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
                          }
                        }
                        else {
                          iVar2 = strcmp(__s1,"v2d");
                          if (iVar2 == 0) {
                            if (pAVar4 == (Attribute *)0x0) {
                              local_3a8 = (TypedAttribute<Imath_3_1::Vec2<double>_> *)0x0;
                            }
                            else {
                              local_3a8 = (TypedAttribute<Imath_3_1::Vec2<double>_> *)
                                          __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                         &TypedAttribute<Imath_3_1::Vec2<double>>::
                                                          typeinfo,0);
                            }
                            if (local_3a8 == (TypedAttribute<Imath_3_1::Vec2<double>_> *)0x0) {
                              uVar7 = __cxa_allocate_exception(0x48);
                              Iex_3_3::ArgExc::ArgExc
                                        ((ArgExc *)in_stack_fffffffffffffa00,
                                         (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                          in_stack_fffffffffffff9f8));
                              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc)
                              ;
                            }
                            std::
                            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)in_stack_fffffffffffffa00);
                            Header::ConstIterator::name((ConstIterator *)0x945514);
                            TypedAttribute<Imath_3_1::Vec2<double>_>::value(local_3a8);
                            eVar3 = exr_attr_set_v2d(in_stack_fffffffffffffa28,
                                                     (int)((ulong)in_stack_fffffffffffffa20 >> 0x20)
                                                     ,(char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                       in_stack_fffffffffffffa18),
                                                     (exr_attr_v2d_t *)in_stack_fffffffffffffa10);
                            if (eVar3 != 0) {
                              uVar7 = __cxa_allocate_exception(0x48);
                              Iex_3_3::ArgExc::ArgExc
                                        ((ArgExc *)in_stack_fffffffffffffa00,
                                         (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                          in_stack_fffffffffffff9f8));
                              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc)
                              ;
                            }
                          }
                          else {
                            iVar2 = strcmp(__s1,"v3i");
                            if (iVar2 == 0) {
                              if (pAVar4 == (Attribute *)0x0) {
                                local_3e0 = (TypedAttribute<Imath_3_1::Vec3<int>_> *)0x0;
                              }
                              else {
                                local_3e0 = (TypedAttribute<Imath_3_1::Vec3<int>_> *)
                                            __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                           &TypedAttribute<Imath_3_1::Vec3<int>>::
                                                            typeinfo,0);
                              }
                              if (local_3e0 == (TypedAttribute<Imath_3_1::Vec3<int>_> *)0x0) {
                                uVar7 = __cxa_allocate_exception(0x48);
                                Iex_3_3::ArgExc::ArgExc
                                          ((ArgExc *)in_stack_fffffffffffffa00,
                                           (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                            in_stack_fffffffffffff9f8));
                                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                            Iex_3_3::ArgExc::~ArgExc);
                              }
                              std::
                              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)in_stack_fffffffffffffa00);
                              Header::ConstIterator::name((ConstIterator *)0x9456e2);
                              TypedAttribute<Imath_3_1::Vec3<int>_>::value(local_3e0);
                              eVar3 = exr_attr_set_v3i(in_stack_fffffffffffffa28,
                                                       (int)((ulong)in_stack_fffffffffffffa20 >>
                                                            0x20),
                                                       (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                        in_stack_fffffffffffffa18),
                                                       (exr_attr_v3i_t *)in_stack_fffffffffffffa10);
                              if (eVar3 != 0) {
                                uVar7 = __cxa_allocate_exception(0x48);
                                Iex_3_3::ArgExc::ArgExc
                                          ((ArgExc *)in_stack_fffffffffffffa00,
                                           (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                            in_stack_fffffffffffff9f8));
                                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                            Iex_3_3::ArgExc::~ArgExc);
                              }
                            }
                            else {
                              iVar2 = strcmp(__s1,"v3f");
                              if (iVar2 == 0) {
                                if (pAVar4 == (Attribute *)0x0) {
                                  local_418 = (TypedAttribute<Imath_3_1::Vec3<float>_> *)0x0;
                                }
                                else {
                                  local_418 = (TypedAttribute<Imath_3_1::Vec3<float>_> *)
                                              __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                             &TypedAttribute<Imath_3_1::Vec3<float>>
                                                              ::typeinfo,0);
                                }
                                if (local_418 == (TypedAttribute<Imath_3_1::Vec3<float>_> *)0x0) {
                                  uVar7 = __cxa_allocate_exception(0x48);
                                  Iex_3_3::ArgExc::ArgExc
                                            ((ArgExc *)in_stack_fffffffffffffa00,
                                             (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                              in_stack_fffffffffffff9f8));
                                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                              Iex_3_3::ArgExc::~ArgExc);
                                }
                                std::
                                __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)in_stack_fffffffffffffa00);
                                Header::ConstIterator::name((ConstIterator *)0x9458b0);
                                TypedAttribute<Imath_3_1::Vec3<float>_>::value(local_418);
                                eVar3 = exr_attr_set_v3f(in_stack_fffffffffffffa28,
                                                         (int)((ulong)in_stack_fffffffffffffa20 >>
                                                              0x20),
                                                         (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                          in_stack_fffffffffffffa18)
                                                         ,(exr_attr_v3f_t *)
                                                          in_stack_fffffffffffffa10);
                                if (eVar3 != 0) {
                                  uVar7 = __cxa_allocate_exception(0x48);
                                  Iex_3_3::ArgExc::ArgExc
                                            ((ArgExc *)in_stack_fffffffffffffa00,
                                             (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                              in_stack_fffffffffffff9f8));
                                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                              Iex_3_3::ArgExc::~ArgExc);
                                }
                              }
                              else {
                                iVar2 = strcmp(__s1,"v3d");
                                if (iVar2 == 0) {
                                  if (pAVar4 == (Attribute *)0x0) {
                                    local_450 = (TypedAttribute<Imath_3_1::Vec3<double>_> *)0x0;
                                  }
                                  else {
                                    local_450 = (TypedAttribute<Imath_3_1::Vec3<double>_> *)
                                                __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                               &
                                                  TypedAttribute<Imath_3_1::Vec3<double>>::typeinfo,
                                                  0);
                                  }
                                  if (local_450 == (TypedAttribute<Imath_3_1::Vec3<double>_> *)0x0)
                                  {
                                    uVar7 = __cxa_allocate_exception(0x48);
                                    Iex_3_3::ArgExc::ArgExc
                                              ((ArgExc *)in_stack_fffffffffffffa00,
                                               (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                in_stack_fffffffffffff9f8));
                                    __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                Iex_3_3::ArgExc::~ArgExc);
                                  }
                                  std::
                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)in_stack_fffffffffffffa00);
                                  Header::ConstIterator::name((ConstIterator *)0x945a7e);
                                  TypedAttribute<Imath_3_1::Vec3<double>_>::value(local_450);
                                  eVar3 = exr_attr_set_v3d(in_stack_fffffffffffffa28,
                                                           (int)((ulong)in_stack_fffffffffffffa20 >>
                                                                0x20),
                                                           (char *)CONCAT44(
                                                  in_stack_fffffffffffffa1c,
                                                  in_stack_fffffffffffffa18),
                                                  (exr_attr_v3d_t *)in_stack_fffffffffffffa10);
                                  if (eVar3 != 0) {
                                    uVar7 = __cxa_allocate_exception(0x48);
                                    Iex_3_3::ArgExc::ArgExc
                                              ((ArgExc *)in_stack_fffffffffffffa00,
                                               (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                in_stack_fffffffffffff9f8));
                                    __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                Iex_3_3::ArgExc::~ArgExc);
                                  }
                                }
                                else {
                                  iVar2 = strcmp(__s1,"m33f");
                                  if (iVar2 == 0) {
                                    if (pAVar4 == (Attribute *)0x0) {
                                      local_488 = (TypedAttribute<Imath_3_1::Matrix33<float>_> *)0x0
                                      ;
                                    }
                                    else {
                                      local_488 = (TypedAttribute<Imath_3_1::Matrix33<float>_> *)
                                                  __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imath_3_1::Matrix33<float>>::
                                                  typeinfo,0);
                                    }
                                    if (local_488 ==
                                        (TypedAttribute<Imath_3_1::Matrix33<float>_> *)0x0) {
                                      uVar7 = __cxa_allocate_exception(0x48);
                                      Iex_3_3::ArgExc::ArgExc
                                                ((ArgExc *)in_stack_fffffffffffffa00,
                                                 (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                  in_stack_fffffffffffff9f8));
                                      __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                  Iex_3_3::ArgExc::~ArgExc);
                                    }
                                    std::
                                    __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator*((__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)in_stack_fffffffffffffa00);
                                    Header::ConstIterator::name((ConstIterator *)0x945c4c);
                                    TypedAttribute<Imath_3_1::Matrix33<float>_>::value(local_488);
                                    eVar3 = exr_attr_set_m33f(in_stack_fffffffffffffa28,
                                                              (int)((ulong)in_stack_fffffffffffffa20
                                                                   >> 0x20),
                                                              (char *)CONCAT44(
                                                  in_stack_fffffffffffffa1c,
                                                  in_stack_fffffffffffffa18),
                                                  (exr_attr_m33f_t *)in_stack_fffffffffffffa10);
                                    if (eVar3 != 0) {
                                      uVar7 = __cxa_allocate_exception(0x48);
                                      Iex_3_3::ArgExc::ArgExc
                                                ((ArgExc *)in_stack_fffffffffffffa00,
                                                 (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                  in_stack_fffffffffffff9f8));
                                      __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                  Iex_3_3::ArgExc::~ArgExc);
                                    }
                                  }
                                  else {
                                    iVar2 = strcmp(__s1,"m33d");
                                    if (iVar2 == 0) {
                                      if (pAVar4 == (Attribute *)0x0) {
                                        local_4c0 = (TypedAttribute<Imath_3_1::Matrix33<double>_> *)
                                                    0x0;
                                      }
                                      else {
                                        local_4c0 = (TypedAttribute<Imath_3_1::Matrix33<double>_> *)
                                                    __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_1::Matrix33<double>>::
                                                  typeinfo,0);
                                      }
                                      if (local_4c0 ==
                                          (TypedAttribute<Imath_3_1::Matrix33<double>_> *)0x0) {
                                        uVar7 = __cxa_allocate_exception(0x48);
                                        Iex_3_3::ArgExc::ArgExc
                                                  ((ArgExc *)in_stack_fffffffffffffa00,
                                                   (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                    in_stack_fffffffffffff9f8));
                                        __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                    Iex_3_3::ArgExc::~ArgExc);
                                      }
                                      std::
                                      __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                      Header::ConstIterator::name((ConstIterator *)0x945e1a);
                                      TypedAttribute<Imath_3_1::Matrix33<double>_>::value(local_4c0)
                                      ;
                                      eVar3 = exr_attr_set_m33d(in_stack_fffffffffffffa28,
                                                                (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_m33d_t *)in_stack_fffffffffffffa10);
                                      if (eVar3 != 0) {
                                        uVar7 = __cxa_allocate_exception(0x48);
                                        Iex_3_3::ArgExc::ArgExc
                                                  ((ArgExc *)in_stack_fffffffffffffa00,
                                                   (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                    in_stack_fffffffffffff9f8));
                                        __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                    Iex_3_3::ArgExc::~ArgExc);
                                      }
                                    }
                                    else {
                                      iVar2 = strcmp(__s1,"m44f");
                                      if (iVar2 == 0) {
                                        if (pAVar4 == (Attribute *)0x0) {
                                          local_4f8 = (TypedAttribute<Imath_3_1::Matrix44<float>_> *
                                                      )0x0;
                                        }
                                        else {
                                          local_4f8 = (TypedAttribute<Imath_3_1::Matrix44<float>_> *
                                                      )__dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                      &
                                                  TypedAttribute<Imath_3_1::Matrix44<float>>::
                                                  typeinfo,0);
                                        }
                                        if (local_4f8 ==
                                            (TypedAttribute<Imath_3_1::Matrix44<float>_> *)0x0) {
                                          uVar7 = __cxa_allocate_exception(0x48);
                                          Iex_3_3::ArgExc::ArgExc
                                                    ((ArgExc *)in_stack_fffffffffffffa00,
                                                     (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                      in_stack_fffffffffffff9f8));
                                          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                      Iex_3_3::ArgExc::~ArgExc);
                                        }
                                        std::
                                        __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                        Header::ConstIterator::name((ConstIterator *)0x945fe8);
                                        TypedAttribute<Imath_3_1::Matrix44<float>_>::value
                                                  (local_4f8);
                                        eVar3 = exr_attr_set_m44f(in_stack_fffffffffffffa28,
                                                                  (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_m44f_t *)in_stack_fffffffffffffa10);
                                        if (eVar3 != 0) {
                                          uVar7 = __cxa_allocate_exception(0x48);
                                          Iex_3_3::ArgExc::ArgExc
                                                    ((ArgExc *)in_stack_fffffffffffffa00,
                                                     (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                      in_stack_fffffffffffff9f8));
                                          __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                      Iex_3_3::ArgExc::~ArgExc);
                                        }
                                      }
                                      else {
                                        iVar2 = strcmp(__s1,"m44d");
                                        if (iVar2 == 0) {
                                          if (pAVar4 == (Attribute *)0x0) {
                                            local_530 = (
                                                  TypedAttribute<Imath_3_1::Matrix44<double>_> *)0x0
                                            ;
                                          }
                                          else {
                                            local_530 = (
                                                  TypedAttribute<Imath_3_1::Matrix44<double>_> *)
                                                  __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                 &
                                                  TypedAttribute<Imath_3_1::Matrix44<double>>::
                                                  typeinfo,0);
                                          }
                                          if (local_530 ==
                                              (TypedAttribute<Imath_3_1::Matrix44<double>_> *)0x0) {
                                            uVar7 = __cxa_allocate_exception(0x48);
                                            Iex_3_3::ArgExc::ArgExc
                                                      ((ArgExc *)in_stack_fffffffffffffa00,
                                                       (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                        in_stack_fffffffffffff9f8));
                                            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                        Iex_3_3::ArgExc::~ArgExc);
                                          }
                                          std::
                                          __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                          Header::ConstIterator::name((ConstIterator *)0x9461b6);
                                          TypedAttribute<Imath_3_1::Matrix44<double>_>::value
                                                    (local_530);
                                          eVar3 = exr_attr_set_m44d(in_stack_fffffffffffffa28,
                                                                    (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_m44d_t *)in_stack_fffffffffffffa10);
                                          if (eVar3 != 0) {
                                            uVar7 = __cxa_allocate_exception(0x48);
                                            Iex_3_3::ArgExc::ArgExc
                                                      ((ArgExc *)in_stack_fffffffffffffa00,
                                                       (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                        in_stack_fffffffffffff9f8));
                                            __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                        Iex_3_3::ArgExc::~ArgExc);
                                          }
                                        }
                                        else {
                                          iVar2 = strcmp(__s1,"box2i");
                                          if (iVar2 == 0) {
                                            if (pAVar4 == (Attribute *)0x0) {
                                              local_568 = (
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>
                                                  *)0x0;
                                            }
                                            else {
                                              local_568 = (
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>
                                                  *)__dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>>>
                                                  ::typeinfo,0);
                                            }
                                            if (local_568 ==
                                                (TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>
                                                 *)0x0) {
                                              uVar7 = __cxa_allocate_exception(0x48);
                                              Iex_3_3::ArgExc::ArgExc
                                                        ((ArgExc *)in_stack_fffffffffffffa00,
                                                         (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                          in_stack_fffffffffffff9f8)
                                                        );
                                              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                          Iex_3_3::ArgExc::~ArgExc);
                                            }
                                            std::
                                            __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                            Header::ConstIterator::name((ConstIterator *)0x946384);
                                            TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::
                                            value(local_568);
                                            eVar3 = exr_attr_set_box2i(in_stack_fffffffffffffa28,
                                                                       (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_box2i_t *)in_stack_fffffffffffffa10);
                                            if (eVar3 != 0) {
                                              uVar7 = __cxa_allocate_exception(0x48);
                                              Iex_3_3::ArgExc::ArgExc
                                                        ((ArgExc *)in_stack_fffffffffffffa00,
                                                         (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                                          in_stack_fffffffffffff9f8)
                                                        );
                                              __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                          Iex_3_3::ArgExc::~ArgExc);
                                            }
                                          }
                                          else {
                                            iVar2 = strcmp(__s1,"box2f");
                                            if (iVar2 == 0) {
                                              if (pAVar4 == (Attribute *)0x0) {
                                                local_5a0 = (
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_>
                                                  *)0x0;
                                              }
                                              else {
                                                local_5a0 = (
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_>
                                                  *)__dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                   &
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>>>
                                                  ::typeinfo,0);
                                              }
                                              if (local_5a0 ==
                                                  (
                                                  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_>
                                                  *)0x0) {
                                                uVar7 = __cxa_allocate_exception(0x48);
                                                Iex_3_3::ArgExc::ArgExc
                                                          ((ArgExc *)in_stack_fffffffffffffa00,
                                                           (char *)CONCAT44(
                                                  in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                                                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                            Iex_3_3::ArgExc::~ArgExc);
                                              }
                                              std::
                                              __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                              in_stack_fffffffffffffa50 =
                                                   Header::ConstIterator::name
                                                             ((ConstIterator *)0x94652b);
                                              TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_>
                                              ::value(local_5a0);
                                              eVar3 = exr_attr_set_box2f(in_stack_fffffffffffffa28,
                                                                         (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_box2f_t *)in_stack_fffffffffffffa10);
                                              if (eVar3 != 0) {
                                                uVar7 = __cxa_allocate_exception(0x48);
                                                Iex_3_3::ArgExc::ArgExc
                                                          ((ArgExc *)in_stack_fffffffffffffa00,
                                                           (char *)CONCAT44(
                                                  in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                                                __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                            Iex_3_3::ArgExc::~ArgExc);
                                              }
                                            }
                                            else {
                                              iVar2 = strcmp(__s1,"chromaticities");
                                              if (iVar2 == 0) {
                                                if (pAVar4 == (Attribute *)0x0) {
                                                  in_stack_fffffffffffffa28 = (exr_context_t)0x0;
                                                  in_stack_fffffffffffffa30 = pAVar4;
                                                }
                                                else {
                                                  in_stack_fffffffffffffa28 =
                                                       (exr_context_t)
                                                       __dynamic_cast(pAVar4,&Attribute::typeinfo,
                                                                      &
                                                  TypedAttribute<Imf_3_3::Chromaticities>::typeinfo,
                                                  0);
                                                  in_stack_fffffffffffffa30 = pAVar4;
                                                }
                                                if (in_stack_fffffffffffffa28 == (exr_context_t)0x0)
                                                {
                                                  uVar7 = __cxa_allocate_exception(0x48);
                                                  Iex_3_3::ArgExc::ArgExc
                                                            ((ArgExc *)in_stack_fffffffffffffa00,
                                                             (char *)CONCAT44(
                                                  in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                                                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                              Iex_3_3::ArgExc::~ArgExc);
                                                }
                                                TypedAttribute<Imf_3_3::Chromaticities>::value
                                                          ((TypedAttribute<Imf_3_3::Chromaticities>
                                                            *)in_stack_fffffffffffffa28);
                                                Chromaticities::Chromaticities
                                                          (in_stack_fffffffffffffa00,
                                                           (Chromaticities *)
                                                           CONCAT44(in_stack_fffffffffffff9fc,
                                                                    in_stack_fffffffffffff9f8));
                                                pp_Var8 = std::
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  ::operator*((
                                                  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)in_stack_fffffffffffffa00);
                                                in_stack_fffffffffffffa10 = *pp_Var8;
                                                in_stack_fffffffffffffa1c = in_ESI;
                                                Header::ConstIterator::name
                                                          ((ConstIterator *)0x946773);
                                                eVar3 = exr_attr_set_chromaticities
                                                                  (in_stack_fffffffffffffa28,
                                                                   (int)((ulong)
                                                  in_stack_fffffffffffffa20 >> 0x20),
                                                  (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                   in_stack_fffffffffffffa18),
                                                  (exr_attr_chromaticities_t *)
                                                  in_stack_fffffffffffffa10);
                                                if (eVar3 != 0) {
                                                  uVar7 = __cxa_allocate_exception(0x48);
                                                  Iex_3_3::ArgExc::ArgExc
                                                            ((ArgExc *)in_stack_fffffffffffffa00,
                                                             (char *)CONCAT44(
                                                  in_stack_fffffffffffff9fc,
                                                  in_stack_fffffffffffff9f8));
                                                  __cxa_throw(uVar7,&Iex_3_3::ArgExc::typeinfo,
                                                              Iex_3_3::ArgExc::~ArgExc);
                                                }
                                              }
                                              else {
                                                iVar2 = strcmp(__s1,"stringvector");
                                                if ((((iVar2 != 0) &&
                                                     (iVar2 = strcmp(__s1,"floatvector"), iVar2 != 0
                                                     )) && (iVar2 = strcmp(__s1,"preview"),
                                                           iVar2 != 0)) &&
                                                   (((iVar2 = strcmp(__s1,"rational"), iVar2 != 0 &&
                                                     (iVar2 = strcmp(__s1,"timecode"), iVar2 != 0))
                                                    && (iVar2 = strcmp(__s1,"keycode"), iVar2 != 0))
                                                   )) {
                                                  strcmp(__s1,"deepImageState");
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffa00);
  } while( true );
}

Assistant:

void Context::addHeader (int partnum, const Header &h)
{
    exr_result_t rv;
    // TODO: ImfHeader iterator types should support operator* so they can
    // use ranged-based for
    for (auto i = h.begin (); i != h.end (); ++i)
    {
        const Attribute& a = i.attribute ();
        const char* attrT = a.typeName ();

        if (!strcmp (i.name (), "channels"))
        {
            const ChannelList& chans = h.channels ();

            for (auto c = chans.begin (); c != chans.end (); ++c)
            {
                const Channel &cdef = c.channel ();
                rv = exr_add_channel (
                    *_ctxt, partnum, c.name (),
                    (exr_pixel_type_t)cdef.type,
                    cdef.pLinear ? EXR_PERCEPTUALLY_LINEAR : EXR_PERCEPTUALLY_LOGARITHMIC,
                    cdef.xSampling,
                    cdef.ySampling);
                if (rv != EXR_ERR_SUCCESS)
                    throw IEX_NAMESPACE::ArgExc ("Unable to copy channel information");
            }
            continue;
        }

        if (!strcmp (i.name (), "lineOrder"))
        {
            const LineOrderAttribute *attr =
                dynamic_cast<const LineOrderAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            rv = exr_set_lineorder (
                *_ctxt, partnum, (exr_lineorder_t)attr->value ());
            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "tiledesc"))
        {
            const TileDescriptionAttribute *attr =
                dynamic_cast<const TileDescriptionAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            TileDescription td = attr->value ();

            rv = exr_set_tile_descriptor (
                *_ctxt, partnum,
                td.xSize,
                td.ySize,
                (exr_tile_level_mode_t)td.mode,
                (exr_tile_round_mode_t)td.roundingMode);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        EXR_SET_ATTR(string, StringAttribute, attr->value ().c_str ());
        EXR_SET_ATTR(int, IntAttribute, attr->value ());
        EXR_SET_ATTR(float, FloatAttribute, attr->value ());
        EXR_SET_ATTR(double, DoubleAttribute, attr->value ());
        EXR_SET_ATTR(compression, CompressionAttribute, (exr_compression_t)attr->value ());
        EXR_SET_ATTR(envmap, EnvmapAttribute, (exr_envmap_t)attr->value ());
        EXR_SET_ATTR(v2i, V2iAttribute,
                     reinterpret_cast<const exr_attr_v2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2f, V2fAttribute,
                     reinterpret_cast<const exr_attr_v2f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v2d, V2dAttribute,
                     reinterpret_cast<const exr_attr_v2d_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3i, V3iAttribute,
                     reinterpret_cast<const exr_attr_v3i_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3f, V3fAttribute,
                     reinterpret_cast<const exr_attr_v3f_t*>(&(attr->value ())));
        EXR_SET_ATTR(v3d, V3dAttribute,
                     reinterpret_cast<const exr_attr_v3d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33f, M33fAttribute,
                     reinterpret_cast<const exr_attr_m33f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m33d, M33dAttribute,
                     reinterpret_cast<const exr_attr_m33d_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44f, M44fAttribute,
                     reinterpret_cast<const exr_attr_m44f_t*>(&(attr->value ())));
        EXR_SET_ATTR(m44d, M44dAttribute,
                     reinterpret_cast<const exr_attr_m44d_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2i, Box2iAttribute,
                     reinterpret_cast<const exr_attr_box2i_t*>(&(attr->value ())));
        EXR_SET_ATTR(box2f, Box2fAttribute,
                     reinterpret_cast<const exr_attr_box2f_t*>(&(attr->value ())));

        if (!strcmp (attrT, "chromaticities"))
        {
            const ChromaticitiesAttribute *attr =
                dynamic_cast<const ChromaticitiesAttribute*> (&a);
            if (!attr)
                throw IEX_NAMESPACE::ArgExc ("unexpected type mismatch");
            Chromaticities ac = attr->value ();
            exr_attr_chromaticities_t cac;

            cac.red_x = ac.red.x;
            cac.red_y = ac.red.y;
            cac.green_x = ac.green.x;
            cac.green_y = ac.green.y;
            cac.blue_x = ac.blue.x;
            cac.blue_y = ac.blue.y;
            cac.white_x = ac.white.x;
            cac.white_y = ac.white.y;

            rv = exr_attr_set_chromaticities (
                *_ctxt, partnum, i.name (), &cac);

            if (rv != EXR_ERR_SUCCESS)
                throw IEX_NAMESPACE::ArgExc ("Unable to copy attribute");
            continue;
        }

        if (!strcmp (attrT, "stringvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "floatvector"))
        {
            continue;
        }

        if (!strcmp (attrT, "preview"))
        {
            continue;
        }

        if (!strcmp (attrT, "rational"))
        {
            continue;
        }

        if (!strcmp (attrT, "timecode"))
        {
            continue;
        }

        if (!strcmp (attrT, "keycode"))
        {
            continue;
        }

        if (!strcmp (attrT, "deepImageState"))
        {
            continue;
        }

        //THROW (
        //    IEX_NAMESPACE::LogicExc,
        //    "Conversion of attribute '" << i.name () << "' of type '" << attrT
        //    << "' to core value not yet implemented");
    }
}